

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap2Local.cpp
# Opt level: O0

void __thiscall
wasm::anon_unknown_22::Struct2Local::Struct2Local
          (Struct2Local *this,StructNew *allocation,EscapeAnalyzer *analyzer,Function *func,
          Module *wasm)

{
  vector<wasm::Field,_std::allocator<wasm::Field>_> *this_00;
  bool bVar1;
  Struct *pSVar2;
  reference pFVar3;
  ReFinalize local_1f0;
  uintptr_t local_88;
  Index local_7c;
  uintptr_t uStack_78;
  Field field;
  __normal_iterator<const_wasm::Field_*,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>
  local_60;
  const_iterator __end2;
  const_iterator __begin2;
  FieldList *__range2;
  Module *local_30;
  Module *wasm_local;
  Function *func_local;
  EscapeAnalyzer *analyzer_local;
  StructNew *allocation_local;
  Struct2Local *this_local;
  
  local_30 = wasm;
  wasm_local = (Module *)func;
  func_local = (Function *)analyzer;
  analyzer_local = (EscapeAnalyzer *)allocation;
  allocation_local = (StructNew *)this;
  PostWalker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>
  ::PostWalker(&this->
                super_PostWalker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>
              );
  this->allocation = (StructNew *)analyzer_local;
  this->analyzer = (EscapeAnalyzer *)func_local;
  this->func = (Function *)wasm_local;
  this->wasm = local_30;
  Builder::Builder(&this->builder,local_30);
  __range2 = (FieldList *)wasm::Type::getHeapType((Type *)&analyzer_local->parents);
  pSVar2 = HeapType::getStruct((HeapType *)&__range2);
  this->fields = &pSVar2->fields;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->localIndexes);
  this->refinalize = false;
  this_00 = this->fields;
  __end2 = std::vector<wasm::Field,_std::allocator<wasm::Field>_>::begin(this_00);
  local_60._M_current =
       (Field *)std::vector<wasm::Field,_std::allocator<wasm::Field>_>::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&__end2,&local_60);
    if (!bVar1) break;
    pFVar3 = __gnu_cxx::
             __normal_iterator<const_wasm::Field_*,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>
             ::operator*(&__end2);
    local_88 = (pFVar3->type).id;
    field.type.id._0_4_ = pFVar3->packedType;
    field.type.id._4_4_ = pFVar3->mutable_;
    uStack_78 = local_88;
    local_7c = Builder::addVar((Function *)wasm_local,(Type)local_88);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (&this->localIndexes,&local_7c);
    __gnu_cxx::
    __normal_iterator<const_wasm::Field_*,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>
    ::operator++(&__end2);
  }
  Walker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>
  ::walk((Walker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>
          *)this,(Expression **)&wasm_local->elementSegments);
  if ((this->refinalize & 1U) != 0) {
    ReFinalize::ReFinalize(&local_1f0);
    Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::walkFunctionInModule
              (&local_1f0.
                super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
                .
                super_PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>
                .super_Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>,
               (Function *)wasm_local,local_30);
    ReFinalize::~ReFinalize(&local_1f0);
  }
  return;
}

Assistant:

Struct2Local(StructNew* allocation,
               EscapeAnalyzer& analyzer,
               Function* func,
               Module& wasm)
    : allocation(allocation), analyzer(analyzer), func(func), wasm(wasm),
      builder(wasm), fields(allocation->type.getHeapType().getStruct().fields) {

    // Allocate locals to store the allocation's fields in.
    for (auto field : fields) {
      localIndexes.push_back(builder.addVar(func, field.type));
    }

    // Replace the things we need to using the visit* methods.
    walk(func->body);

    if (refinalize) {
      ReFinalize().walkFunctionInModule(func, &wasm);
    }
  }